

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O2

void __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::UGlobal
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,TPZFMatrix<long_double> *U1,
          TPZFMatrix<long_double> *result)

{
  TPZFMatrix<long_double> *y;
  TPZMatrixSolver<long_double> *pTVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var7;
  unkbyte10 Var8;
  TPZFMatrix<long_double> K01U1;
  TPZFMatrix<long_double> u0;
  longdouble local_168;
  TPZFMatrix<long_double> local_158;
  TPZFMatrix<long_double> local_c0;
  
  y = &this->fF0;
  TPZFMatrix<long_double>::TPZFMatrix
            (&local_c0,(this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow,
             (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol);
  if (this->fK01IsComputed == true) {
    if (this->fF0IsComputed == false) {
      DecomposeK00(this);
      pTVar1 = ((this->fSolver).fRef)->fPointer;
      (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(pTVar1,y,y,0);
      this->fF0IsComputed = true;
    }
    Var7 = in_ST5;
    Var8 = in_ST5;
    TPZFMatrix<long_double>::MultAdd(&this->fK01,U1,y,&local_c0,-(longdouble)1,(longdouble)1,0);
  }
  else {
    local_168 = (longdouble)0;
    TPZFMatrix<long_double>::TPZFMatrix
              (&local_158,(this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow,
               (U1->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol,&local_168);
    Var7 = in_ST5;
    Var8 = in_ST5;
    TPZFMatrix<long_double>::MultAdd(&this->fK01,U1,y,&local_158,-(longdouble)1,(longdouble)1,0);
    DecomposeK00(this);
    pTVar1 = ((this->fSolver).fRef)->fPointer;
    (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
              (pTVar1,&local_158,&local_c0,0);
    TPZFMatrix<long_double>::~TPZFMatrix(&local_158);
  }
  (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xe])(result,this->fDim1 + this->fDim0,
           (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < (this->fF0).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol;
      lVar5 = lVar5 + 1) {
    lVar6 = 0;
    for (lVar3 = 0; lVar2 = this->fDim0, lVar3 < lVar2; lVar3 = lVar3 + 1) {
      local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix._0_10_ =
           *(unkbyte10 *)
            ((long)local_c0.fElem +
            lVar6 + local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow * lVar4);
      Var8 = Var7;
      (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(result,lVar3,lVar5,&local_158);
      lVar6 = lVar6 + 0x10;
    }
    for (lVar6 = 0; lVar6 + lVar3 < lVar2 + this->fDim1; lVar6 = lVar6 + 1) {
      (*(U1->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(U1,lVar6,lVar5);
      local_158.super_TPZMatrix<long_double>.super_TPZBaseMatrix._0_10_ = in_ST0;
      (*(result->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(result,lVar6 + lVar3,lVar5,&local_158);
      lVar2 = this->fDim0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = Var7;
      Var7 = Var8;
    }
    lVar4 = lVar4 + 0x10;
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZMatRed<TVar, TSideMatrix >::UGlobal(const TPZFMatrix<TVar> & U1, TPZFMatrix<TVar> & result)
{
	TPZFMatrix<TVar> u0( fF0.Rows() , fF0.Cols() );
	
	if(fK01IsComputed)
	{
		//[u0]=[A00^-1][F0]-[A00^-1][A01]
        //compute [F0]=[A00^-1][F0]
        if(!fF0IsComputed)
        {
            DecomposeK00();
            fSolver->Solve(fF0,fF0);
            fF0IsComputed = true;
        }
		//make [u0]=[F0]-[U1]
		fK01.MultAdd(U1,(fF0),u0,-1,1);
	} else {
        TPZFMatrix<TVar> K01U1(fK01.Rows(),U1.Cols(),0.);
        fK01.MultAdd(U1,fF0,K01U1,-1.,1.);
        DecomposeK00();
        fSolver->Solve(K01U1, u0);
	}
	
	//compute result
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
        U1.Print("U1 = ",sout,EMathematicaInput);
		fF0.Print("fF0 ",sout,EMathematicaInput);
		u0.Print("u0 " ,sout,EMathematicaInput);
		LOGPZ_DEBUG(logger,sout.str())   
		
	}
#endif
	
	result.Redim( fDim0+fDim1,fF0.Cols() );
	int64_t c,r,r1;
	
	for(c=0; c<fF0.Cols(); c++)
	{
		r1=0;
		for(r=0; r<fDim0; r++)
		{
			result.PutVal( r,c,u0.GetVal(r,c) ) ;
		}
		//aqui r=fDim0
		for( ;r<fDim0+fDim1; r++)
		{
			result.PutVal( r,c,U1.GetVal(r1++,c) );
		}
	}
}